

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

SmallVector<llvm::StringRef,_2U> *
getNames(SmallVector<llvm::StringRef,_2U> *__return_storage_ptr__,DWARFDie *DIE,
        bool IncludeLinkageName)

{
  StringRef LHS;
  bool bVar1;
  Tag TVar2;
  reference pSVar3;
  StringRef local_68;
  char *local_58;
  size_t sStack_50;
  char *local_40;
  char *Str_1;
  char *local_28;
  char *Str;
  DWARFDie *pDStack_18;
  bool IncludeLinkageName_local;
  DWARFDie *DIE_local;
  SmallVector<llvm::StringRef,_2U> *Result;
  
  Str._6_1_ = 0;
  Str._7_1_ = IncludeLinkageName;
  pDStack_18 = DIE;
  DIE_local = (DWARFDie *)__return_storage_ptr__;
  llvm::SmallVector<llvm::StringRef,_2U>::SmallVector(__return_storage_ptr__);
  local_28 = llvm::DWARFDie::getName(pDStack_18,ShortName);
  if (local_28 == (char *)0x0) {
    TVar2 = llvm::DWARFDie::getTag(pDStack_18);
    if (TVar2 == DW_TAG_namespace) {
      llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const(&)[22]>
                (&__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>,
                 (char (*) [22])"(anonymous namespace)");
    }
  }
  else {
    llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>
              (&__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>,&local_28);
  }
  if (((Str._7_1_ & 1) != 0) &&
     (local_40 = llvm::DWARFDie::getName(pDStack_18,LinkageName), local_40 != (char *)0x0)) {
    bVar1 = llvm::SmallVectorBase::empty((SmallVectorBase *)__return_storage_ptr__);
    if (!bVar1) {
      pSVar3 = llvm::SmallVectorTemplateCommon<llvm::StringRef,_void>::operator[]
                         ((SmallVectorTemplateCommon<llvm::StringRef,_void> *)__return_storage_ptr__
                          ,0);
      local_58 = pSVar3->Data;
      sStack_50 = pSVar3->Length;
      llvm::StringRef::StringRef(&local_68,local_40);
      LHS.Length = sStack_50;
      LHS.Data = local_58;
      bVar1 = llvm::operator!=(LHS,local_68);
      if (!bVar1) {
        return __return_storage_ptr__;
      }
    }
    llvm::SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>
              (&__return_storage_ptr__->super_SmallVectorImpl<llvm::StringRef>,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

static SmallVector<StringRef, 2> getNames(const DWARFDie &DIE,
                                          bool IncludeLinkageName = true) {
  SmallVector<StringRef, 2> Result;
  if (const char *Str = DIE.getName(DINameKind::ShortName))
    Result.emplace_back(Str);
  else if (DIE.getTag() == dwarf::DW_TAG_namespace)
    Result.emplace_back("(anonymous namespace)");

  if (IncludeLinkageName) {
    if (const char *Str = DIE.getName(DINameKind::LinkageName)) {
      if (Result.empty() || Result[0] != Str)
        Result.emplace_back(Str);
    }
  }

  return Result;
}